

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O2

void writeSolutionFile(FILE *file,HighsOptions *options,HighsModel *model,HighsBasis *basis,
                      HighsSolution *solution,HighsInfo *info,HighsModelStatus model_status,
                      HighsInt style)

{
  HighsLogOptions *pHVar1;
  bool have_primal;
  pointer pHVar2;
  FILE *file_00;
  HighsVarType *integrality;
  allocator local_229;
  array<char,_32UL> objStr;
  string local_208;
  HighsInfo *local_1e8;
  FILE *local_1e0;
  HighsLogOptions *local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  stringstream ss;
  undefined1 local_1a8 [376];
  
  pHVar1 = &(options->super_HighsOptionsStruct).log_options;
  local_1e8 = info;
  if (style == 1) {
    local_1c0 = (ulong)basis->valid;
    local_1d0 = (ulong)solution->dual_valid;
    pHVar2 = (model->lp_).integrality_.
             super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
             super__Vector_impl_data._M_start;
    integrality = (HighsVarType *)0x0;
    if ((model->lp_).integrality_.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
        _M_impl.super__Vector_impl_data._M_finish != pHVar2) {
      integrality = pHVar2;
    }
    have_primal = solution->value_valid;
    local_1c8 = (ulong)have_primal;
    local_1d8 = (HighsLogOptions *)&(model->lp_).col_names_;
    local_1e0 = (FILE *)&solution->col_value;
    writeModelBoundSolution
              (file,pHVar1,true,(model->lp_).num_col_,&(model->lp_).col_lower_,
               &(model->lp_).col_upper_,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1d8,have_primal,(vector<double,_std::allocator<double>_> *)local_1e0,
               solution->dual_valid,&solution->col_dual,basis->valid,&basis->col_status,integrality)
    ;
    local_1e0 = file;
    local_1d8 = pHVar1;
    writeModelBoundSolution
              (file,pHVar1,false,(model->lp_).num_row_,&(model->lp_).row_lower_,
               &(model->lp_).row_upper_,&(model->lp_).row_names_,have_primal,&solution->row_value,
               SUB81(local_1d0,0),&solution->row_dual,SUB81(local_1c0,0),&basis->row_status,
               (HighsVarType *)0x0);
    std::__cxx11::string::string((string *)&ss,"\n",(allocator *)&objStr);
    pHVar1 = local_1d8;
    file_00 = local_1e0;
    highsFprintfString(local_1e0,local_1d8,(string *)&ss);
    std::__cxx11::string::~string((string *)&ss);
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    objStr._M_elems._0_8_ = objStr._M_elems + 0x10;
    objStr._M_elems[8] = '\0';
    objStr._M_elems[9] = '\0';
    objStr._M_elems[10] = '\0';
    objStr._M_elems[0xb] = '\0';
    objStr._M_elems[0xc] = '\0';
    objStr._M_elems[0xd] = '\0';
    objStr._M_elems[0xe] = '\0';
    objStr._M_elems[0xf] = '\0';
    objStr._M_elems[0x10] = '\0';
    std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
    std::__cxx11::string::~string((string *)&objStr);
    utilModelStatusToString_abi_cxx11_(&local_208,model_status);
    highsFormatToString_abi_cxx11_
              ((string *)&objStr,"Model status: %s\n",local_208._M_dataplus._M_p);
    std::operator<<((ostream *)local_1a8,(string *)&objStr);
    std::__cxx11::string::~string((string *)&objStr);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::stringbuf::str();
    highsFprintfString(file_00,pHVar1,(string *)&objStr);
    std::__cxx11::string::~string((string *)&objStr);
    highsDoubleToString(&objStr,(local_1e8->super_HighsInfoStruct).objective_function_value,1e-13);
    std::__cxx11::string::string((string *)&local_208,"\n",&local_229);
    highsFprintfString(file_00,pHVar1,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    local_208._M_string_length = 0;
    local_208.field_2._M_local_buf[0] = '\0';
    std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
    std::__cxx11::string::~string((string *)&local_208);
    highsFormatToString_abi_cxx11_(&local_208,"Objective value: %s\n",&objStr);
    std::operator<<((ostream *)local_1a8,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::stringbuf::str();
    highsFprintfString(file_00,pHVar1,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
  }
  else {
    if (style == -1) {
      writeOldRawSolution(file,pHVar1,&model->lp_,basis,solution);
      return;
    }
    if ((style & 0xfffffffeU) == 2) {
      writeGlpsolSolution(file,options,model,basis,solution,model_status,info,style == 2);
      return;
    }
    std::__cxx11::string::string((string *)&ss,"Model status\n",(allocator *)&objStr);
    highsFprintfString(file,pHVar1,(string *)&ss);
    std::__cxx11::string::~string((string *)&ss);
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    objStr._M_elems._0_8_ = objStr._M_elems + 0x10;
    objStr._M_elems[8] = '\0';
    objStr._M_elems[9] = '\0';
    objStr._M_elems[10] = '\0';
    objStr._M_elems[0xb] = '\0';
    objStr._M_elems[0xc] = '\0';
    objStr._M_elems[0xd] = '\0';
    objStr._M_elems[0xe] = '\0';
    objStr._M_elems[0xf] = '\0';
    objStr._M_elems[0x10] = '\0';
    std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
    std::__cxx11::string::~string((string *)&objStr);
    utilModelStatusToString_abi_cxx11_(&local_208,model_status);
    highsFormatToString_abi_cxx11_((string *)&objStr,"%s\n",local_208._M_dataplus._M_p);
    std::operator<<((ostream *)local_1a8,(string *)&objStr);
    std::__cxx11::string::~string((string *)&objStr);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::stringbuf::str();
    highsFprintfString(file,pHVar1,(string *)&objStr);
    std::__cxx11::string::~string((string *)&objStr);
    writeModelSolution(file,pHVar1,model,solution,local_1e8,style == 4);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return;
}

Assistant:

void writeSolutionFile(FILE* file, const HighsOptions& options,
                       const HighsModel& model, const HighsBasis& basis,
                       const HighsSolution& solution, const HighsInfo& info,
                       const HighsModelStatus model_status,
                       const HighsInt style) {
  const bool have_primal = solution.value_valid;
  const bool have_dual = solution.dual_valid;
  const bool have_basis = basis.valid;
  const HighsLp& lp = model.lp_;
  const HighsLogOptions& log_options = options.log_options;
  if (style == kSolutionStyleOldRaw) {
    writeOldRawSolution(file, log_options, lp, basis, solution);
  } else if (style == kSolutionStylePretty) {
    const HighsVarType* integrality =
        lp.integrality_.size() > 0 ? lp.integrality_.data() : nullptr;
    writeModelBoundSolution(file, log_options, true, lp.num_col_, lp.col_lower_,
                            lp.col_upper_, lp.col_names_, have_primal,
                            solution.col_value, have_dual, solution.col_dual,
                            have_basis, basis.col_status, integrality);
    writeModelBoundSolution(file, log_options, false, lp.num_row_,
                            lp.row_lower_, lp.row_upper_, lp.row_names_,
                            have_primal, solution.row_value, have_dual,
                            solution.row_dual, have_basis, basis.row_status);
    highsFprintfString(file, log_options, "\n");
    std::stringstream ss;
    ss.str(std::string());
    ss << highsFormatToString("Model status: %s\n",
                              utilModelStatusToString(model_status).c_str());
    highsFprintfString(file, log_options, ss.str());
    auto objStr = highsDoubleToString((double)info.objective_function_value,
                                      kHighsSolutionValueToStringTolerance);
    highsFprintfString(file, log_options, "\n");
    ss.str(std::string());
    ss << highsFormatToString("Objective value: %s\n", objStr.data());
    highsFprintfString(file, log_options, ss.str());
  } else if (style == kSolutionStyleGlpsolRaw ||
             style == kSolutionStyleGlpsolPretty) {
    const bool raw = style == kSolutionStyleGlpsolRaw;
    writeGlpsolSolution(file, options, model, basis, solution, model_status,
                        info, raw);
  } else {
    // Standard raw solution file, possibly sparse => only nonzero primal values
    const bool sparse = style == kSolutionStyleSparse;
    assert(style == kSolutionStyleRaw || sparse);
    highsFprintfString(file, log_options, "Model status\n");
    std::stringstream ss;
    ss.str(std::string());
    ss << highsFormatToString("%s\n",
                              utilModelStatusToString(model_status).c_str());
    highsFprintfString(file, log_options, ss.str());
    writeModelSolution(file, log_options, model, solution, info, sparse);
  }
}